

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_DrawPlayerSprites(void)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  lightlist_t *plVar6;
  AActor *pAVar7;
  double dVar8;
  int local_80;
  bool local_79;
  float local_68;
  float local_64;
  float boby;
  float bobx;
  double wy;
  double wx;
  double centerhack;
  F3DFloor *rover;
  int local_38;
  int ceilinglight;
  int floorlight;
  sector_t_conflict *local_28;
  sector_t_conflict *sec;
  DPSprite *weapon;
  DPSprite *psp;
  int lightnum;
  int i;
  
  local_28 = (sector_t_conflict *)0x0;
  if ((R_DrawPlayerSprites()::tempsec == '\0') &&
     (iVar3 = __cxa_guard_acquire(&R_DrawPlayerSprites()::tempsec), iVar3 != 0)) {
    sector_t::sector_t((sector_t *)&R_DrawPlayerSprites::tempsec);
    __cxa_guard_release(&R_DrawPlayerSprites()::tempsec);
  }
  bVar2 = FBoolCVar::operator_cast_to_bool(&r_drawplayersprites);
  if ((((bVar2) && (camera != (AActor *)0x0)) && (camera->player != (player_t *)0x0)) &&
     (((*(uint *)(&DAT_01ae71a8 + (long)consoleplayer * 0x2a0) & 0x20) == 0 &&
      ((bVar2 = FBoolCVar::operator_cast_to_bool(&r_deathcamera), !bVar2 || (0 < camera->health)))))
     ) {
    if ((fixedlightlev < 0) &&
       ((viewsector->e != (extsector_t *)0x0 &&
        (uVar4 = TArray<lightlist_t,_lightlist_t>::Size(&(viewsector->e->XFloor).lightlist),
        uVar4 != 0)))) {
      psp._4_4_ = TArray<lightlist_t,_lightlist_t>::Size(&(viewsector->e->XFloor).lightlist);
      do {
        dVar1 = ViewPos.Z;
        psp._4_4_ = psp._4_4_ - 1;
        if ((int)psp._4_4_ < 0) goto LAB_0038de09;
        plVar6 = TArray<lightlist_t,_lightlist_t>::operator[]
                           (&(viewsector->e->XFloor).lightlist,(long)(int)psp._4_4_);
        dVar8 = secplane_t::Zat0(&plVar6->plane);
      } while (dVar8 < dVar1);
      plVar6 = TArray<lightlist_t,_lightlist_t>::operator[]
                         (&(viewsector->e->XFloor).lightlist,(long)(int)psp._4_4_);
      dVar1 = ViewPos.Z;
      centerhack = (double)plVar6->caster;
      if (((F3DFloor *)centerhack != (F3DFloor *)0x0) &&
         (((((F3DFloor *)centerhack)->flags & 0x10000) == 0 ||
          (dVar8 = secplane_t::Zat0((((F3DFloor *)centerhack)->bottom).plane), dVar8 < dVar1)))) {
        local_28 = *(sector_t_conflict **)((long)centerhack + 0x68);
        if ((*(uint *)((long)centerhack + 0x58) & 0x8000000) == 0) {
          plVar6 = TArray<lightlist_t,_lightlist_t>::operator[]
                             (&(viewsector->e->XFloor).lightlist,(long)(int)psp._4_4_);
          basecolormap = plVar6->extra_colormap;
        }
        else {
          basecolormap = local_28->ColorMap;
        }
      }
LAB_0038de09:
      if (local_28 == (sector_t_conflict *)0x0) {
        local_28 = (sector_t_conflict *)viewsector;
        basecolormap = viewsector->ColorMap;
      }
      rover._4_4_ = (int)local_28->lightlevel;
      local_38 = rover._4_4_;
    }
    else {
      local_28 = R_FakeFlat((sector_t_conflict *)viewsector,&R_DrawPlayerSprites::tempsec,&local_38,
                            (int *)((long)&rover + 4),false);
      basecolormap = local_28->ColorMap;
    }
    local_79 = true;
    if (::level.fadeto == 0) {
      uVar5 = PalEntry::operator_cast_to_unsigned_int(&basecolormap->Fade);
      local_79 = true;
      if (uVar5 == 0) {
        local_79 = (::level.flags & 8) != 0;
      }
    }
    foggy = local_79;
    if (local_79 == false) {
      local_80 = extralight << 4;
    }
    else {
      local_80 = 0;
    }
    r_actualextralight = local_80;
    psp._0_4_ = (local_38 + rover._4_4_ >> 1) + local_80;
    spriteshade = ((int)psp + 0xc) * -0x4000 + 0x280000;
    mfloorclip = screenheightarray;
    mceilingclip = zeroarray;
    if (camera->player != (player_t *)0x0) {
      wx = CenterY;
      CenterY = (double)(viewheight / 2);
      P_BobWeapon(camera->player,&local_64,&local_68,r_TicFracF);
      sec = (sector_t_conflict *)player_t::FindPSprite(camera->player,1);
      if (sec == (sector_t_conflict *)0x0) {
        wy = 0.0;
        _boby = 0.0;
      }
      else if ((*(bool *)&sec->planes[0].Texture.texnum & 1U) == 0) {
        wy = *(double *)&sec->planes[0].Flags +
             (sec->planes[0].xform.Angle.Degrees - *(double *)&sec->planes[0].Flags) * r_TicFracF;
        _boby = sec->planes[0].alpha +
                (sec->planes[0].xform.baseAngle.Degrees - sec->planes[0].alpha) * r_TicFracF;
      }
      else {
        wy = sec->planes[0].xform.Angle.Degrees;
        _boby = sec->planes[0].xform.baseAngle.Degrees;
      }
      for (weapon = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&camera->player->psprites);
          weapon != (DPSprite *)0x0; weapon = DPSprite::GetNext(weapon)) {
        iVar3 = DPSprite::GetID(weapon);
        if (((iVar3 != 0x7ffffffd) || (CrosshairImage == (FTexture *)0x0)) &&
           (pAVar7 = DPSprite::GetCaller(weapon), pAVar7 != (AActor *)0x0)) {
          R_DrawPSprite(weapon,camera,local_64,local_68,wy,_boby,r_TicFracF);
        }
      }
      CenterY = wx;
    }
  }
  return;
}

Assistant:

void R_DrawPlayerSprites ()
{
	int 		i;
	int 		lightnum;
	DPSprite*	psp;
	DPSprite*	weapon;
	sector_t*	sec = NULL;
	static sector_t tempsec;
	int			floorlight, ceilinglight;
	F3DFloor *rover;

	if (!r_drawplayersprites ||
		!camera ||
		!camera->player ||
		(players[consoleplayer].cheats & CF_CHASECAM) ||
		(r_deathcamera && camera->health <= 0))
		return;

	if (fixedlightlev < 0 && viewsector->e && viewsector->e->XFloor.lightlist.Size())
	{
		for (i = viewsector->e->XFloor.lightlist.Size() - 1; i >= 0; i--)
		{
			if (ViewPos.Z <= viewsector->e->XFloor.lightlist[i].plane.Zat0())
			{
				rover = viewsector->e->XFloor.lightlist[i].caster;
				if (rover)
				{
					if (rover->flags & FF_DOUBLESHADOW && ViewPos.Z <= rover->bottom.plane->Zat0())
						break;
					sec = rover->model;
					if (rover->flags & FF_FADEWALLS)
						basecolormap = sec->ColorMap;
					else
						basecolormap = viewsector->e->XFloor.lightlist[i].extra_colormap;
				}
				break;
			}
		}
		if(!sec)
		{
			sec = viewsector;
			basecolormap = sec->ColorMap;
		}
		floorlight = ceilinglight = sec->lightlevel;
	}
	else
	{	// This used to use camera->Sector but due to interpolation that can be incorrect
		// when the interpolated viewpoint is in a different sector than the camera.
		sec = R_FakeFlat (viewsector, &tempsec, &floorlight,
			&ceilinglight, false);

		// [RH] set basecolormap
		basecolormap = sec->ColorMap;
	}

	// [RH] set foggy flag
	foggy = (level.fadeto || basecolormap->Fade || (level.flags & LEVEL_HASFADETABLE));
	r_actualextralight = foggy ? 0 : extralight << 4;

	// get light level
	lightnum = ((floorlight + ceilinglight) >> 1) + r_actualextralight;
	spriteshade = LIGHT2SHADE(lightnum) - 24*FRACUNIT;

	// clip to screen bounds
	mfloorclip = screenheightarray;
	mceilingclip = zeroarray;

	if (camera->player != NULL)
	{
		double centerhack = CenterY;
		double wx, wy;
		float bobx, boby;

		CenterY = viewheight / 2;

		P_BobWeapon (camera->player, &bobx, &boby, r_TicFracF);

		// Interpolate the main weapon layer once so as to be able to add it to other layers.
		if ((weapon = camera->player->FindPSprite(PSP_WEAPON)) != nullptr)
		{
			if (weapon->firstTic)
			{
				wx = weapon->x;
				wy = weapon->y;
			}
			else
			{
				wx = weapon->oldx + (weapon->x - weapon->oldx) * r_TicFracF;
				wy = weapon->oldy + (weapon->y - weapon->oldy) * r_TicFracF;
			}
		}
		else
		{
			wx = 0;
			wy = 0;
		}

		// add all active psprites
		psp = camera->player->psprites;
		while (psp)
		{
			// [RH] Don't draw the targeter's crosshair if the player already has a crosshair set.
			// It's possible this psprite's caller is now null but the layer itself hasn't been destroyed
			// because it didn't tick yet (if we typed 'take all' while in the console for example).
			// In this case let's simply not draw it to avoid crashing.
			if ((psp->GetID() != PSP_TARGETCENTER || CrosshairImage == nullptr) && psp->GetCaller() != nullptr)
			{
				R_DrawPSprite(psp, camera, bobx, boby, wx, wy, r_TicFracF);
			}

			psp = psp->GetNext();
		}

		CenterY = centerhack;
	}
}